

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_select_(char *pattern)

{
  int iVar1;
  char *pcVar2;
  int local_20;
  int local_1c;
  int n;
  int i;
  char *pattern_local;
  
  local_20 = 0;
  local_1c = 0;
  do {
    if (acutest_list_size_ <= local_1c) {
LAB_0010cca8:
      if (local_20 == 0) {
        for (local_1c = 0; local_1c < acutest_list_size_; local_1c = local_1c + 1) {
          iVar1 = acutest_name_contains_word_(acutest_list_[local_1c].name,pattern);
          if (iVar1 != 0) {
            acutest_test_data_[local_1c].state = ACUTEST_STATE_SELECTED;
            local_20 = local_20 + 1;
          }
        }
        if (local_20 < 1) {
          for (local_1c = 0; local_1c < acutest_list_size_; local_1c = local_1c + 1) {
            pcVar2 = strstr(acutest_list_[local_1c].name,pattern);
            if (pcVar2 != (char *)0x0) {
              acutest_test_data_[local_1c].state = ACUTEST_STATE_SELECTED;
              local_20 = local_20 + 1;
            }
          }
          pattern_local._4_4_ = local_20;
        }
        else {
          pattern_local._4_4_ = local_20;
        }
      }
      else {
        pattern_local._4_4_ = local_20;
      }
      return pattern_local._4_4_;
    }
    iVar1 = strcmp(acutest_list_[local_1c].name,pattern);
    if (iVar1 == 0) {
      acutest_test_data_[local_1c].state = ACUTEST_STATE_SELECTED;
      local_20 = 1;
      goto LAB_0010cca8;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int
acutest_select_(const char* pattern)
{
    int i;
    int n = 0;

    /* Try exact match. */
    for(i = 0; i < acutest_list_size_; i++) {
        if(strcmp(acutest_list_[i].name, pattern) == 0) {
            acutest_test_data_[i].state = ACUTEST_STATE_SELECTED;
            n++;
            break;
        }
    }
    if(n > 0)
        return n;

    /* Try word match. */
    for(i = 0; i < acutest_list_size_; i++) {
        if(acutest_name_contains_word_(acutest_list_[i].name, pattern)) {
            acutest_test_data_[i].state = ACUTEST_STATE_SELECTED;
            n++;
        }
    }
    if(n > 0)
        return n;

    /* Try relaxed match. */
    for(i = 0; i < acutest_list_size_; i++) {
        if(strstr(acutest_list_[i].name, pattern) != NULL) {
            acutest_test_data_[i].state = ACUTEST_STATE_SELECTED;
            n++;
        }
    }

    return n;
}